

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::VarToNativeArray
               (Var arrayObject,JsNativeValueType valueType,UINT length,UINT elementSize,
               byte *buffer,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  DynamicObject *pDVar6;
  JavascriptCopyOnAccessNativeIntArray *this;
  undefined4 *puVar7;
  RecyclableObject *this_00;
  JavascriptArray *arrayObject_00;
  JavascriptNativeIntArray *arrayObject_01;
  JavascriptNativeFloatArray *arrayObject_02;
  Type TVar8;
  Var local_40;
  Var arrayObject_local;
  
  local_40 = arrayObject;
  pDVar6 = VarTo<Js::DynamicObject>(arrayObject);
  iVar4 = (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])(pDVar6);
  pvVar2 = local_40;
  if ((-1 < (int)length) && (iVar4 == 0)) {
    if (local_40 != (Var)0x0) {
      bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(local_40);
      if (bVar3) {
        this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar2);
      }
      else {
        this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
    }
    pvVar2 = local_40;
    arrayObject_local._4_4_ = valueType;
    if (local_40 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00acd02b;
      *puVar7 = 0;
    }
    if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00acd02b;
      *puVar7 = 0;
    }
    TVar8 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar8 = TypeIds_Number, (ulong)pvVar2 >> 0x32 == 0)) {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00acd02b;
        *puVar7 = 0;
      }
      TVar8 = ((this_00->type).ptr)->typeId;
      if ((0x57 < (int)TVar8) && (BVar5 = RecyclableObject::IsExternal(this_00), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00acd02b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
    }
    if (TVar8 == TypeIds_ArrayLast) {
      arrayObject_02 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(local_40);
      ObjectToNativeArray<Js::JavascriptNativeFloatArray>
                (arrayObject_02,arrayObject_local._4_4_,length,elementSize,buffer,scriptContext);
      return;
    }
    if (TVar8 == TypeIds_NativeIntArray) {
      arrayObject_01 = UnsafeVarTo<Js::JavascriptNativeIntArray>(local_40);
      ObjectToNativeArray<Js::JavascriptNativeIntArray>
                (arrayObject_01,arrayObject_local._4_4_,length,elementSize,buffer,scriptContext);
      return;
    }
    valueType = arrayObject_local._4_4_;
    if (TVar8 == TypeIds_Array) {
      arrayObject_00 = UnsafeVarTo<Js::JavascriptArray>(local_40);
      ObjectToNativeArray<Js::JavascriptArray>
                (arrayObject_00,arrayObject_local._4_4_,length,elementSize,buffer,scriptContext);
      return;
    }
  }
  ObjectToNativeArray<void*>(&local_40,valueType,length,elementSize,buffer,scriptContext);
  return;
}

Assistant:

void JavascriptOperators::VarToNativeArray(Var arrayObject,
        JsNativeValueType valueType,
        __in UINT length,
        __in UINT elementSize,
        __out_bcount(length*elementSize) byte* buffer,
        Js::ScriptContext* scriptContext)
    {
        Js::DynamicObject* dynamicObject = VarTo<DynamicObject>(arrayObject);
        if (dynamicObject->IsCrossSiteObject() || Js::TaggedInt::IsOverflow(length))
        {
            Js::JavascriptOperators::ObjectToNativeArray(&arrayObject, valueType, length, elementSize, buffer, scriptContext);
        }
        else
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayObject);
#endif
            switch (Js::JavascriptOperators::GetTypeId(arrayObject))
            {
            case TypeIds_Array:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
            case TypeIds_NativeFloatArray:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptNativeFloatArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
            case TypeIds_NativeIntArray:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptNativeIntArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
                // We can have more specialized template if needed.
            default:
                Js::JavascriptOperators::ObjectToNativeArray(&arrayObject, valueType, length, elementSize, buffer, scriptContext);
            }
        }
    }